

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceC.cpp
# Opt level: O0

double SoapySDRDevice_getSampleRate(SoapySDRDevice *device,int direction,size_t channel)

{
  undefined8 in_RDX;
  undefined4 in_ESI;
  long *in_RDI;
  double dVar1;
  exception *ex;
  
  SoapySDRDevice_clearError();
  dVar1 = (double)(**(code **)(*in_RDI + 0x200))(in_RDI,in_ESI,in_RDX);
  return dVar1;
}

Assistant:

double SoapySDRDevice_getSampleRate(const SoapySDRDevice *device, const int direction, const size_t channel)
{
    __SOAPY_SDR_C_TRY
    return device->getSampleRate(direction, channel);
    __SOAPY_SDR_C_CATCH_RET(NAN);
}